

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall XipFile::TocEntry::recordmemusage(TocEntry *this,XipFile *xip,allocmap *m)

{
  allocmap *paVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  size_t sVar5;
  size_t sVar6;
  element_type *peVar7;
  uint local_64;
  int i;
  size_t o32size;
  size_t e32size;
  string local_40;
  allocmap *local_20;
  allocmap *m_local;
  XipFile *xip_local;
  TocEntry *this_local;
  
  local_20 = m;
  m_local = (allocmap *)xip;
  xip_local = (XipFile *)this;
  buildexe(this,xip);
  paVar1 = local_20;
  uVar4 = (this->super_XipEntry)._rvaname;
  XipEntry::name_abi_cxx11_(&local_40,&this->super_XipEntry,(XipFile *)m_local);
  iVar2 = std::__cxx11::string::size();
  uVar3 = roundsize(iVar2 + 1,4);
  allocmap::markused(paVar1,uVar4,uVar3,"modname");
  std::__cxx11::string::~string((string *)&local_40);
  sVar5 = exe_reconstructor::e32rom::size();
  sVar6 = exe_reconstructor::o32rom::size();
  allocmap::markused(local_20,this->_rvae32,(uint32_t)sVar5,"e32hdr");
  paVar1 = local_20;
  uVar4 = this->_rvao32;
  peVar7 = std::__shared_ptr_access<exe_reconstructor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<exe_reconstructor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->_exe);
  uVar3 = exe_reconstructor::nr_o32_sections(peVar7);
  allocmap::markused(paVar1,uVar4,(int)sVar6 * uVar3,"o32hdr");
  local_64 = 0;
  while( true ) {
    peVar7 = std::__shared_ptr_access<exe_reconstructor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<exe_reconstructor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_exe);
    uVar4 = exe_reconstructor::nr_o32_sections(peVar7);
    paVar1 = local_20;
    if (uVar4 <= local_64) break;
    peVar7 = std::__shared_ptr_access<exe_reconstructor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<exe_reconstructor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_exe);
    uVar4 = exe_reconstructor::o32datarva(peVar7,(long)(int)local_64);
    peVar7 = std::__shared_ptr_access<exe_reconstructor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<exe_reconstructor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_exe);
    uVar3 = exe_reconstructor::o32datasize(peVar7,(long)(int)local_64);
    uVar3 = roundsize(uVar3,4);
    allocmap::markused(paVar1,uVar4,uVar3,"objdata");
    local_64 = local_64 + 1;
  }
  return;
}

Assistant:

virtual void recordmemusage(XipFile& xip, allocmap& m)
        {
            buildexe(xip);

            m.markused(_rvaname, roundsize(name(xip).size()+1, 4), "modname");

            size_t e32size= exe_reconstructor::e32rom::size();
            size_t o32size= exe_reconstructor::o32rom::size();

            m.markused(_rvae32, e32size, "e32hdr");
            m.markused(_rvao32, o32size*_exe->nr_o32_sections(), "o32hdr");
            for (int i=0 ; i<_exe->nr_o32_sections() ; i++) {
                m.markused(_exe->o32datarva(i), roundsize(_exe->o32datasize(i), 4), "objdata");
            }
        }